

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Set_Record_R_PDU::SetRecordSets
          (Set_Record_R_PDU *this,
          vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_> *RS)

{
  KUINT16 *pKVar1;
  KUINT16 KVar2;
  pointer pRVar3;
  pointer pRVar4;
  
  pRVar3 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (this->m_vRecs).
                super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar3; pRVar4 = pRVar4 + 1) {
    KVar2 = DATA_TYPE::RecordSet::GetRecordLength(pRVar4);
    pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 - KVar2;
  }
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::clear
            (&this->m_vRecs);
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::operator=
            (&this->m_vRecs,RS);
  pRVar4 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui32NumRecSets = (KUINT32)(((long)pRVar3 - (long)pRVar4) / 0x30);
  for (; pRVar4 != pRVar3; pRVar4 = pRVar4 + 1) {
    KVar2 = DATA_TYPE::RecordSet::GetRecordLength(pRVar4);
    pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar2;
    pRVar3 = (this->m_vRecs).
             super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void Set_Record_R_PDU::SetRecordSets( const vector<RecordSet> & RS )
{
    // Reset the PDU size.
    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= citr->GetRecordLength();
    }

    m_vRecs.clear();
    m_vRecs = RS;
    m_ui32NumRecSets = m_vRecs.size();

    // Calculate the new PDU size
    for( citr = m_vRecs.begin(); citr != m_vRecs.end(); ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}